

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signed_integer_overflow_ubsan.c
# Opt level: O2

int main(void)

{
  printf("Sum of first and second length is %d\n",0x800000ff);
  return 0;
}

Assistant:

int main() {
  int first_len = INT_MAX;
  int second_len = 256;
  int buf_len = 256;
  // Signed Integer Overflow is Undefined Behavior
  int len_sum = first_len + second_len;
  if (len_sum <= buf_len) { // <- sum == 255
    printf("Sum of first and second length is %d\n", len_sum);
  }
}